

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.h
# Opt level: O2

sample_type __thiscall
charls::
jls_codec<charls::default_traits<unsigned_char,_charls::quad<unsigned_char>_>,_charls::encoder_strategy>
::do_regular(jls_codec<charls::default_traits<unsigned_char,_charls::quad<unsigned_char>_>,_charls::encoder_strategy>
             *this,int32_t qs,int32_t x,int32_t predicted,encoder_strategy *param_4)

{
  default_traits<unsigned_char,_charls::quad<unsigned_char>_> *this_00;
  byte bVar1;
  uchar uVar2;
  int iVar3;
  int32_t k;
  uint uVar4;
  uint uVar5;
  int32_t mapped_error;
  int iVar6;
  uint uVar7;
  uint predicted_value;
  context_regular_mode *this_01;
  int error_value;
  uint uVar8;
  
  uVar7 = qs >> 0x1f;
  iVar3 = -qs;
  if (0 < qs) {
    iVar3 = qs;
  }
  this_01 = (this->contexts_)._M_elems + iVar3;
  k = context_regular_mode::get_golomb_coding_parameter(this_01);
  this_00 = &this->traits_;
  uVar8 = 0;
  uVar4 = (((this->contexts_)._M_elems[iVar3].c_ ^ uVar7) - uVar7) + predicted;
  uVar5 = (this->traits_).maximum_sample_value;
  predicted_value = uVar5;
  if ((int)uVar4 < 0) {
    predicted_value = uVar8;
  }
  if ((uVar4 & ~uVar5) == 0) {
    predicted_value = uVar4;
  }
  uVar5 = default_traits<unsigned_char,_charls::quad<unsigned_char>_>::compute_error_value
                    (this_00,(x - predicted_value ^ uVar7) - uVar7);
  if (k == 0 && (this->traits_).near_lossless == 0) {
    uVar8 = (this->contexts_)._M_elems[iVar3].n_ + (this->contexts_)._M_elems[iVar3].b_ * 2 + -1 >>
            0x1f;
  }
  mapped_error = map_error_value(uVar8 ^ uVar5);
  encode_mapped_value(this,k,mapped_error,(this->traits_).limit);
  context_regular_mode::update_variables_and_bias
            (this_01,uVar5,(this->traits_).near_lossless,(this->traits_).reset_threshold);
  error_value = (uVar5 ^ uVar7) - uVar7;
  bVar1 = default_traits<unsigned_char,_charls::quad<unsigned_char>_>::compute_reconstructed_sample
                    (this_00,predicted_value,error_value);
  iVar6 = (uint)bVar1 - x;
  iVar3 = -iVar6;
  if (0 < iVar6) {
    iVar3 = iVar6;
  }
  if (iVar3 <= (this->traits_).near_lossless) {
    uVar2 = default_traits<unsigned_char,_charls::quad<unsigned_char>_>::
            compute_reconstructed_sample(this_00,predicted_value,error_value);
    return uVar2;
  }
  __assert_fail("traits_.is_near(traits_.compute_reconstructed_sample(predicted_value, apply_sign(error_value, sign)), x)"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/cornerstonejs[P]charls/src/scan.h"
                ,0x15c,
                "sample_type charls::jls_codec<charls::default_traits<unsigned char, charls::quad<unsigned char>>, charls::encoder_strategy>::do_regular(const int32_t, const int32_t, const int32_t, encoder_strategy *) [Traits = charls::default_traits<unsigned char, charls::quad<unsigned char>>, Strategy = charls::encoder_strategy]"
               );
}

Assistant:

do_regular(const int32_t qs, const int32_t x, const int32_t predicted,
                                        encoder_strategy* /*template_selector*/)
    {
        const int32_t sign{bit_wise_sign(qs)};
        context_regular_mode& context{contexts_[apply_sign(qs, sign)]};
        const int32_t k{context.get_golomb_coding_parameter()};
        const int32_t predicted_value{traits_.correct_prediction(predicted + apply_sign(context.c(), sign))};
        const int32_t error_value{traits_.compute_error_value(apply_sign(x - predicted_value, sign))};

        encode_mapped_value(k, map_error_value(context.get_error_correction(k | traits_.near_lossless) ^ error_value),
                            traits_.limit);
        context.update_variables_and_bias(error_value, traits_.near_lossless, traits_.reset_threshold);
        ASSERT(traits_.is_near(traits_.compute_reconstructed_sample(predicted_value, apply_sign(error_value, sign)), x));
        return static_cast<sample_type>(
            traits_.compute_reconstructed_sample(predicted_value, apply_sign(error_value, sign)));
    }